

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O0

int array_container_to_uint32_array_vector16
              (void *vout,uint16_t *array,size_t cardinality,uint32_t base)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined8 *puVar5;
  uint in_ECX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  undefined1 auVar6 [16];
  uint32_t val;
  __m256i voutput;
  __m128i vinput;
  size_t i;
  uint32_t *out;
  int outpos;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  ulong local_1b8;
  int local_1a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_1a8 = 0;
  for (local_1b8 = 0; local_1b8 + 8 <= in_RDX; local_1b8 = local_1b8 + 8) {
    auVar3 = vpmovzxwd_avx2(*(undefined1 (*) [16])(in_RSI + local_1b8 * 2));
    auVar1 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar1 = vpinsrd_avx(auVar1,in_ECX,2);
    auVar1 = vpinsrd_avx(auVar1,in_ECX,3);
    auVar2 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar2 = vpinsrd_avx(auVar2,in_ECX,2);
    auVar2 = vpinsrd_avx(auVar2,in_ECX,3);
    auVar6 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    uStack_70 = auVar6._0_8_;
    uStack_68 = auVar6._8_8_;
    auVar4._16_8_ = uStack_70;
    auVar4._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    auVar4._24_8_ = uStack_68;
    auVar3 = vpaddd_avx2(auVar3,auVar4);
    puVar5 = (undefined8 *)(in_RDI + (long)local_1a8 * 4);
    local_200 = auVar3._0_8_;
    uStack_1f8 = auVar3._8_8_;
    uStack_1f0 = auVar3._16_8_;
    uStack_1e8 = auVar3._24_8_;
    *puVar5 = local_200;
    puVar5[1] = uStack_1f8;
    puVar5[2] = uStack_1f0;
    puVar5[3] = uStack_1e8;
    local_1a8 = local_1a8 + 8;
  }
  for (; local_1b8 < in_RDX; local_1b8 = local_1b8 + 1) {
    *(uint *)(in_RDI + (long)local_1a8 * 4) = in_ECX + *(ushort *)(in_RSI + local_1b8 * 2);
    local_1a8 = local_1a8 + 1;
  }
  return local_1a8;
}

Assistant:

ALLOW_UNALIGNED
int array_container_to_uint32_array_vector16(void *vout, const uint16_t *array,
                                             size_t cardinality,
                                             uint32_t base) {
    int outpos = 0;
    uint32_t *out = (uint32_t *)vout;
    size_t i = 0;
    for (; i + sizeof(__m128i) / sizeof(uint16_t) <= cardinality;
         i += sizeof(__m128i) / sizeof(uint16_t)) {
        __m128i vinput = _mm_loadu_si128((const __m128i *)(array + i));
        __m256i voutput = _mm256_add_epi32(_mm256_cvtepu16_epi32(vinput),
                                           _mm256_set1_epi32(base));
        _mm256_storeu_si256((__m256i *)(out + outpos), voutput);
        outpos += sizeof(__m256i) / sizeof(uint32_t);
    }
    for (; i < cardinality; ++i) {
        const uint32_t val = base + array[i];
        memcpy(out + outpos, &val,
               sizeof(uint32_t));  // should be compiled as a MOV on x64
        outpos++;
    }
    return outpos;
}